

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.hpp
# Opt level: O2

void JEBDebug::internal::
     write<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
               (ostream *os,__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end)

{
  int iVar1;
  ostream *this;
  
  if (begin._M_current != end._M_current) {
    iVar1 = *begin._M_current;
    begin._M_current = begin._M_current + 1;
    std::ostream::operator<<((ostream *)os,iVar1);
  }
  for (; begin._M_current != end._M_current; begin._M_current = begin._M_current + 1) {
    this = std::operator<<(os,", ");
    std::ostream::operator<<((ostream *)this,*begin._M_current);
  }
  return;
}

Assistant:

void write(std::ostream& os, It begin, It end)
    {
        if (begin != end)
            os << *begin++;
        for (; begin != end; begin++)
            os << ", " << *begin;
    }